

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15b07f::CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test::TestBody
          (CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test *this)

{
  long in_RDI;
  int elapsed_time;
  int k_1;
  int ref_elapsed_time;
  int k;
  aom_usec_timer timer;
  aom_usec_timer ref_timer;
  int16_t dst_ref [1024];
  int16_t dst [1024];
  int in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  int local_1064;
  int local_105c;
  CFLTestWithData<unsigned_short> *in_stack_ffffffffffffefc0;
  aom_usec_timer local_1028;
  undefined1 local_1008 [24];
  int in_stack_fffffffffffff010;
  int in_stack_fffffffffffff014;
  undefined1 local_808 [2056];
  
  CFLTestWithData<unsigned_short>::randData(in_stack_ffffffffffffefc0,0);
  ::aom_usec_timer_start((aom_usec_timer *)0x41e74e);
  for (local_105c = 0; local_105c < 0x7fff; local_105c = local_105c + 1) {
    (**(code **)(in_RDI + 0x1038))(in_RDI + 0x830,local_1008);
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0x41e795);
  ::aom_usec_timer_elapsed(&local_1028);
  ::aom_usec_timer_start((aom_usec_timer *)0x41e7ad);
  for (local_1064 = 0; local_1064 < 0x7fff; local_1064 = local_1064 + 1) {
    (**(code **)(in_RDI + 0x1030))(in_RDI + 0x30,local_808);
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0x41e7f4);
  ::aom_usec_timer_elapsed((aom_usec_timer *)&stack0xffffffffffffefb8);
  printSpeed((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffef8c,
             in_stack_ffffffffffffef88);
  assertFaster(in_stack_fffffffffffff014,in_stack_fffffffffffff010);
  return;
}

Assistant:

TEST_P(CFLSubAvgTest, DISABLED_SubAvgSpeedTest) {
  int16_t dst[CFL_BUF_SQUARE];
  int16_t dst_ref[CFL_BUF_SQUARE];
  aom_usec_timer ref_timer;
  aom_usec_timer timer;
  randData(&ACMRandom::Rand15);
  aom_usec_timer_start(&ref_timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg_ref(data_ref, dst_ref);
  }
  aom_usec_timer_mark(&ref_timer);
  int ref_elapsed_time = (int)aom_usec_timer_elapsed(&ref_timer);
  aom_usec_timer_start(&timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg(data, dst);
  }
  aom_usec_timer_mark(&timer);
  int elapsed_time = (int)aom_usec_timer_elapsed(&timer);
  printSpeed(ref_elapsed_time, elapsed_time, width, height);
  assertFaster(ref_elapsed_time, elapsed_time);
}